

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O3

char * __thiscall
cmCommandArgumentParserHelper::ExpandSpecialVariable
          (cmCommandArgumentParserHelper *this,char *key,char *var)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  cmState *this_00;
  char *pcVar5;
  _Alloc_hider _Var6;
  ostringstream e;
  string local_1b8;
  undefined1 local_198 [112];
  ios_base local_128 [264];
  
  if (key == (char *)0x0) {
    pcVar5 = ExpandVariable(this,var);
    return pcVar5;
  }
  if (var == (char *)0x0) {
    return this->EmptyVariable;
  }
  iVar3 = strcmp(key,"ENV");
  if (iVar3 == 0) {
    local_198._8_8_ = 0;
    local_198[0x10] = '\0';
    local_198._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_198 + 0x10);
    bVar2 = cmsys::SystemTools::GetEnv(var,(string *)local_198);
    if (bVar2) {
      if (this->EscapeQuotes == true) {
        cmSystemTools::EscapeQuotes(&local_1b8,(string *)local_198);
        this = (cmCommandArgumentParserHelper *)AddString(this,&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        this = (cmCommandArgumentParserHelper *)AddString(this,(string *)local_198);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_198 + 0x10)) {
      return this->EmptyVariable;
    }
  }
  else {
    iVar3 = strcmp(key,"CACHE");
    if (iVar3 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Syntax $",8);
      sVar4 = strlen(key);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,key,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"{} is not supported.  ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Only ${}, $ENV{}, and $CACHE{} are allowed.",0x2b);
      std::__cxx11::stringbuf::str();
      if ((this->ErrorString)._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&this->ErrorString);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base(local_128);
      return (char *)0x0;
    }
    this_00 = cmMakefile::GetState(this->Makefile);
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_198 + 0x10);
    local_198._0_8_ = paVar1;
    sVar4 = strlen(var);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,var,var + sVar4);
    pcVar5 = cmState::GetInitializedCacheValue(this_00,(string *)local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ != paVar1) {
      operator_delete((void *)local_198._0_8_,CONCAT71(local_198._17_7_,local_198[0x10]) + 1);
    }
    if (pcVar5 == (char *)0x0) {
      return this->EmptyVariable;
    }
    if (this->EscapeQuotes == true) {
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      sVar4 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,pcVar5,pcVar5 + sVar4);
      cmSystemTools::EscapeQuotes((string *)local_198,&local_1b8);
      this = (cmCommandArgumentParserHelper *)AddString(this,(string *)local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._0_8_ != paVar1) {
        operator_delete((void *)local_198._0_8_,CONCAT71(local_198._17_7_,local_198[0x10]) + 1);
      }
      _Var6._M_p = local_1b8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p == &local_1b8.field_2) {
        return this->EmptyVariable;
      }
      goto LAB_00429e6f;
    }
    local_198._0_8_ = paVar1;
    sVar4 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,pcVar5,pcVar5 + sVar4);
    this = (cmCommandArgumentParserHelper *)AddString(this,(string *)local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._0_8_ == paVar1) {
      return this->EmptyVariable;
    }
  }
  local_1b8.field_2._M_allocated_capacity = CONCAT71(local_198._17_7_,local_198[0x10]);
  _Var6._M_p = (pointer)local_198._0_8_;
LAB_00429e6f:
  operator_delete(_Var6._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  return this->EmptyVariable;
}

Assistant:

char* cmCommandArgumentParserHelper::ExpandSpecialVariable(const char* key,
                                                           const char* var)
{
  if (!key) {
    return this->ExpandVariable(var);
  }
  if (!var) {
    return this->EmptyVariable;
  }
  if (strcmp(key, "ENV") == 0) {
    std::string str;
    if (cmSystemTools::GetEnv(var, str)) {
      if (this->EscapeQuotes) {
        return this->AddString(cmSystemTools::EscapeQuotes(str));
      }
      return this->AddString(str);
    }
    return this->EmptyVariable;
  }
  if (strcmp(key, "CACHE") == 0) {
    if (const char* c =
          this->Makefile->GetState()->GetInitializedCacheValue(var)) {
      if (this->EscapeQuotes) {
        return this->AddString(cmSystemTools::EscapeQuotes(c));
      }
      return this->AddString(c);
    }
    return this->EmptyVariable;
  }
  std::ostringstream e;
  e << "Syntax $" << key << "{} is not supported.  "
    << "Only ${}, $ENV{}, and $CACHE{} are allowed.";
  this->SetError(e.str());
  return CM_NULLPTR;
}